

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NavierStokesBase.cpp
# Opt level: O0

MultiFab * __thiscall
NavierStokesBase::getState
          (NavierStokesBase *this,int ngrow,int state_indx,int strt_comp,int num_comp,Real time)

{
  MFInfo *pMVar1;
  StateData *pSVar2;
  BoxArray *pBVar3;
  DistributionMapping *dm;
  int in_ESI;
  int in_R8D;
  MultiFab *mf;
  int in_stack_0000017c;
  int in_stack_00000180;
  int in_stack_00000184;
  Real in_stack_00000188;
  int in_stack_00000194;
  MultiFab *in_stack_00000198;
  AmrLevel *in_stack_000001a0;
  int in_stack_000001b0;
  size_type in_stack_ffffffffffffff48;
  AmrLevel *in_stack_ffffffffffffff50;
  MFInfo *info;
  MultiFab *this_00;
  FabFactory<amrex::FArrayBox> *in_stack_ffffffffffffffa0;
  _func_int **local_58;
  undefined8 uStack_50;
  undefined8 local_48;
  undefined8 uStack_40;
  undefined8 local_38;
  undefined8 local_28;
  undefined4 local_18;
  undefined4 local_c;
  
  local_18 = in_R8D;
  local_c = in_ESI;
  pMVar1 = (MFInfo *)operator_new(0x180);
  info = pMVar1;
  pSVar2 = amrex::Vector<amrex::StateData,_std::allocator<amrex::StateData>_>::operator[]
                     ((Vector<amrex::StateData,_std::allocator<amrex::StateData>_> *)
                      in_stack_ffffffffffffff50,in_stack_ffffffffffffff48);
  pBVar3 = amrex::StateData::boxArray(pSVar2);
  pSVar2 = amrex::Vector<amrex::StateData,_std::allocator<amrex::StateData>_>::operator[]
                     ((Vector<amrex::StateData,_std::allocator<amrex::StateData>_> *)
                      in_stack_ffffffffffffff50,in_stack_ffffffffffffff48);
  dm = amrex::StateData::DistributionMap(pSVar2);
  local_48 = 0;
  uStack_40 = 0;
  local_58 = (_func_int **)0x0;
  uStack_50 = 0;
  local_38 = 0;
  this_00 = (MultiFab *)&stack0xffffffffffffffa8;
  amrex::MFInfo::MFInfo((MFInfo *)0x51d713);
  amrex::AmrLevel::Factory(in_stack_ffffffffffffff50);
  amrex::MultiFab::MultiFab
            (this_00,(BoxArray *)CONCAT44(local_c,local_18),dm,(int)((ulong)pBVar3 >> 0x20),
             (int)pBVar3,info,in_stack_ffffffffffffffa0);
  amrex::MFInfo::~MFInfo((MFInfo *)0x51d759);
  local_28 = pMVar1;
  amrex::AmrLevel::FillPatch
            (in_stack_000001a0,in_stack_00000198,in_stack_00000194,in_stack_00000188,
             in_stack_00000184,in_stack_00000180,in_stack_0000017c,in_stack_000001b0);
  return (MultiFab *)(MFInfo *)local_28;
}

Assistant:

MultiFab*
NavierStokesBase::getState (int  ngrow,
                            int  state_indx,
                            int  strt_comp,
                            int  num_comp,
                            Real time)
{
    BL_PROFILE("NavierStokesBase::getState()");

    MultiFab* mf = new MultiFab(state[state_indx].boxArray(),
                                state[state_indx].DistributionMap(),
                                num_comp,ngrow,MFInfo(),Factory());

    FillPatch(*this,*mf,ngrow,time,state_indx,strt_comp,num_comp,0);

    return mf;
}